

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O2

TA_RetCode
TA_MAVP_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_ParamHolderOptInput *pTVar1;
  TA_RetCode TVar2;
  
  pTVar1 = params->optIn;
  TVar2 = TA_MAVP(startIdx,endIdx,(params->in->data).inReal,params->in[1].data.inReal,
                  (pTVar1->data).optInInteger,pTVar1[1].data.optInInteger,
                  pTVar1[2].data.optInInteger,outBegIdx,outNBElement,(params->out->data).outReal);
  return TVar2;
}

Assistant:

TA_RetCode TA_MAVP_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MAVP(
/* Generated */              startIdx,
/* Generated */              endIdx,
/* Generated */              params->in[0].data.inReal, /* inReal */
/* Generated */              params->in[1].data.inReal, /* inPeriods */
/* Generated */              params->optIn[0].data.optInInteger, /* optInMinPeriod*/
/* Generated */              params->optIn[1].data.optInInteger, /* optInMaxPeriod*/
/* Generated */              (TA_MAType)params->optIn[2].data.optInInteger, /* optInMAType*/
/* Generated */              outBegIdx, 
/* Generated */              outNBElement, 
/* Generated */              params->out[0].data.outReal /*  outReal */ );
/* Generated */ }